

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name)

{
  Pattern *in_RDI;
  Choice in_stack_00000094;
  string *in_stack_00000098;
  WildcardPattern *in_stack_000000a0;
  string *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  Pattern::Pattern(in_RDI);
  (in_RDI->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__NamePattern_00226a48;
  toLower(in_stack_ffffffffffffffc8);
  WildcardPattern::WildcardPattern(in_stack_000000a0,in_stack_00000098,in_stack_00000094);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

NamePattern( std::string const& name )
            : m_wildcardPattern( toLower( name ), CaseSensitive::No )
            {}